

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_features.pb.cc
# Opt level: O2

void pb::CppFeatures::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/cpp_features.pb.cc"
             ,0xb4,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void CppFeatures::SharedDtor(MessageLite& self) {
  CppFeatures& this_ = static_cast<CppFeatures&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}